

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  bool bVar1;
  OfType _type;
  undefined1 local_118 [104];
  undefined1 local_b0 [8];
  MessageInfo info;
  Totals *_totals_local;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages_local;
  AssertionResult *_assertionResult_local;
  AssertionStats *this_local;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_001edbe0;
  AssertionResult::AssertionResult(&this->assertionResult,_assertionResult);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  memcpy(&this->totals,_totals,0x30);
  bVar1 = AssertionResult::hasMessage(&this->assertionResult);
  if (bVar1) {
    AssertionResult::getTestMacroName_abi_cxx11_((AssertionResult *)(local_118 + 0x48));
    AssertionResult::getSourceInfo((SourceLineInfo *)(local_118 + 0x20),&this->assertionResult);
    _type = AssertionResult::getResultType(&this->assertionResult);
    MessageInfo::MessageInfo
              ((MessageInfo *)local_b0,(string *)(local_118 + 0x48),
               (SourceLineInfo *)(local_118 + 0x20),_type);
    SourceLineInfo::~SourceLineInfo((SourceLineInfo *)(local_118 + 0x20));
    std::__cxx11::string::~string((string *)(local_118 + 0x48));
    AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_118);
    std::__cxx11::string::operator=((string *)&info.type,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,(value_type *)local_b0);
    MessageInfo::~MessageInfo((MessageInfo *)local_b0);
  }
  return;
}

Assistant:

AssertionStats( AssertionResult const& _assertionResult,
                        std::vector<MessageInfo> const& _infoMessages,
                        Totals const& _totals )
        :   assertionResult( _assertionResult ),
            infoMessages( _infoMessages ),
            totals( _totals )
        {
            if( assertionResult.hasMessage() ) {
                // Copy message into messages list.
                MessageInfo info( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
                info.message = assertionResult.getMessage();
                infoMessages.push_back( info );
            }
        }